

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.h
# Opt level: O3

void __thiscall
icu_63::MaybeStackArray<char,_40>::MaybeStackArray
          (MaybeStackArray<char,_40> *this,MaybeStackArray<char,_40> *src)

{
  char *__src;
  int iVar1;
  char *pcVar2;
  
  pcVar2 = src->ptr;
  this->ptr = pcVar2;
  iVar1 = src->capacity;
  this->capacity = iVar1;
  this->needToRelease = src->needToRelease;
  __src = src->stackArray;
  if (pcVar2 != __src) {
    src->ptr = __src;
    src->capacity = 0x28;
    src->needToRelease = '\0';
    return;
  }
  this->ptr = this->stackArray;
  memcpy(this->stackArray,__src,(long)iVar1);
  return;
}

Assistant:

icu::MaybeStackArray<T, stackCapacity>::MaybeStackArray(
        MaybeStackArray <T, stackCapacity>&& src) U_NOEXCEPT
        : ptr(src.ptr), capacity(src.capacity), needToRelease(src.needToRelease) {
    if (src.ptr == src.stackArray) {
        ptr = stackArray;
        uprv_memcpy(stackArray, src.stackArray, sizeof(T) * src.capacity);
    } else {
        src.resetToStackArray();  // take ownership away from src
    }
}